

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O3

Color __thiscall PlasticBSDF::f(PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Color CVar14;
  
  fVar10 = ABS(wo->z);
  fVar4 = *(float *)&(this->super_BSDF).field_0x24;
  fVar7 = 1.0 - fVar10 * fVar10;
  if (fVar7 <= 0.0) {
    fVar7 = 0.0;
  }
  fVar8 = SQRT(fVar7) / fVar4;
  fVar7 = 1.0;
  if (fVar8 < 1.0) {
    fVar7 = 1.0 - fVar8 * fVar8;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar8 = (fVar4 * fVar10 - fVar7) / (fVar4 * fVar10 + fVar7);
    fVar4 = (fVar10 - fVar4 * fVar7) / (fVar4 * fVar7 + fVar10);
    fVar7 = (fVar4 * fVar4 + fVar8 * fVar8) * 0.5;
  }
  fVar4 = 1.0 - wi->z * wi->z;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar10 = 0.0;
  fVar4 = fVar4 / *(float *)&(this->super_BSDF).field_0x24;
  uVar5 = 0;
  if (fVar4 < 1.0) {
    fVar4 = 1.0 - fVar4 * fVar4;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar10 = *(float *)&(this->super_BSDF).field_0x24;
    fVar11 = 1.0 / fVar10;
    fVar8 = 1.0 - fVar4 * fVar4;
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    fVar9 = SQRT(fVar8) / fVar11;
    fVar8 = 1.0;
    if (fVar9 < 1.0) {
      fVar10 = 1.0 - fVar9 * fVar9;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar8 = (fVar11 * fVar4 - fVar10) / (fVar11 * fVar4 + fVar10);
      fVar4 = (fVar4 - fVar11 * fVar10) / (fVar11 * fVar10 + fVar4);
      fVar8 = (fVar4 * fVar4 + fVar8 * fVar8) * 0.5;
      fVar10 = *(float *)&(this->super_BSDF).field_0x24;
    }
    auVar12._0_4_ = (1.0 - fVar7) * (1.0 - fVar8);
    fVar4 = 1.0 / (fVar10 * fVar10);
    fVar7 = 1.0 - this->outRatio;
    uVar1 = albedo->x;
    uVar2 = albedo->y;
    auVar12._4_4_ = auVar12._0_4_;
    auVar12._8_4_ = auVar12._0_4_;
    auVar12._12_4_ = auVar12._0_4_;
    auVar3._4_4_ = 1.0 - fVar7 * (float)uVar2;
    auVar3._0_4_ = 1.0 - fVar7 * (float)uVar1;
    auVar3._8_4_ = 0.0 - fVar7 * 0.0;
    auVar3._12_4_ = 0.0 - fVar7 * 0.0;
    auVar13 = divps(auVar12,auVar3);
    auVar6._0_4_ = fVar4 * auVar13._0_4_;
    auVar6._4_4_ = fVar4 * auVar13._4_4_;
    auVar6._8_4_ = fVar4 * auVar13._8_4_;
    auVar6._12_4_ = fVar4 * auVar13._12_4_;
    auVar13._4_4_ = PI;
    auVar13._0_4_ = PI;
    auVar13._8_4_ = PI;
    auVar13._12_4_ = PI;
    auVar13 = divps(auVar6,auVar13);
    uVar5 = CONCAT44(auVar13._4_4_ * (float)uVar2,auVar13._0_4_ * (float)uVar1);
    fVar10 = (((auVar12._0_4_ / (1.0 - fVar7 * albedo->z)) * fVar4) / PI) * albedo->z;
  }
  CVar14.z = fVar10;
  CVar14.x = (float)(int)uVar5;
  CVar14.y = (float)(int)((ulong)uVar5 >> 0x20);
  return CVar14;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const
	{
		// non-Dirac component only
		float energy = 1;
		energy *= 1 - DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		float sint = sqrtf(1-wi.z*wi.z)/IOR;
		if (sint >= 1) return 0; // total reflect (shouldn't happen if IOR>1)
		float cost = sqrtf(1-sint*sint);
		energy *= 1 - DielectricBRDF::reflectivity(cost, 1/IOR);
		float ratio2 = 1/(IOR*IOR); // see note_refract_radiance
		return energy / (1 - albedo * (1-outRatio)) * ratio2 * 1/PI * albedo;
	}